

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

void glfwGetMonitorWorkarea(GLFWmonitor *handle,int *xpos,int *ypos,int *width,int *height)

{
  int iVar1;
  int iVar2;
  XRRScreenResources *sr;
  XRRCrtcInfo *pXVar3;
  XRRModeInfo *pXVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  _GLFWmonitor *monitor;
  int iVar11;
  int iVar12;
  bool bVar13;
  int iStack_68;
  int iStack_64;
  ulong *puStack_40;
  uchar *puStack_38;
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((_glfw.x11.randr.available == 0) || (_glfw.x11.randr.monitorBroken != 0)) {
    iStack_68 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x18 + (long)_glfw.x11.screen * 0x80)
    ;
    iStack_64 = *(int *)(*(long *)(_glfw.x11.display + 0xe8) + 0x1c + (long)_glfw.x11.screen * 0x80)
    ;
    iVar9 = 0;
    iVar12 = 0;
  }
  else {
    sr = (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    pXVar3 = (*_glfw.x11.randr.GetCrtcInfo)(_glfw.x11.display,sr,*(RRCrtc *)(handle + 0x90));
    iVar12 = pXVar3->x;
    iVar9 = pXVar3->y;
    pXVar4 = getModeInfo(sr,pXVar3->mode);
    lVar10 = 8;
    lVar8 = 0xc;
    if ((pXVar3->rotation != 2) && (pXVar3->rotation != 8)) {
      lVar10 = 0xc;
      lVar8 = 8;
    }
    iStack_68 = *(int *)((long)&pXVar4->id + lVar8);
    iStack_64 = *(int *)((long)&pXVar4->id + lVar10);
    (*_glfw.x11.randr.FreeCrtcInfo)(pXVar3);
    (*_glfw.x11.randr.FreeScreenResources)(sr);
  }
  if ((_glfw.x11.NET_WORKAREA == 0) || (_glfw.x11.NET_CURRENT_DESKTOP == 0)) goto LAB_0022cfc6;
  puStack_38 = (uchar *)0x0;
  puStack_40 = (ulong *)0x0;
  uVar5 = _glfwGetWindowPropertyX11(_glfw.x11.root,_glfw.x11.NET_WORKAREA,6,&puStack_38);
  uVar6 = _glfwGetWindowPropertyX11
                    (_glfw.x11.root,_glfw.x11.NET_CURRENT_DESKTOP,6,(uchar **)&puStack_40);
  if ((uVar6 == 0 || uVar5 < 4) || (uVar5 >> 2 <= *puStack_40)) {
    if (puStack_38 != (uchar *)0x0) goto LAB_0022cfb2;
  }
  else {
    lVar10 = *puStack_40 * 0x20;
    iVar1 = *(int *)(puStack_38 + lVar10);
    iVar2 = *(int *)(puStack_38 + lVar10 + 8);
    iVar11 = iVar12 - iVar1;
    bVar13 = iVar11 == 0;
    if (iVar1 <= iVar12) {
      iVar11 = 0;
    }
    if (bVar13 || iVar12 < iVar1) {
      iVar12 = iVar1;
    }
    iVar11 = iVar11 + iStack_68;
    iVar7 = iVar9 - iVar2;
    bVar13 = iVar7 == 0;
    if (iVar2 <= iVar9) {
      iVar7 = 0;
    }
    if (bVar13 || iVar9 < iVar2) {
      iVar9 = iVar2;
    }
    iVar7 = iVar7 + iStack_64;
    iStack_68 = (iVar1 - iVar12) + *(int *)(puStack_38 + lVar10 + 0x10);
    if (iVar11 + iVar12 <= *(int *)(puStack_38 + lVar10 + 0x10) + iVar1) {
      iStack_68 = iVar11;
    }
    iStack_64 = (iVar2 - iVar9) + *(int *)(puStack_38 + lVar10 + 0x18);
    if (iVar7 + iVar9 <= *(int *)(puStack_38 + lVar10 + 0x18) + iVar2) {
      iStack_64 = iVar7;
    }
LAB_0022cfb2:
    XFree();
  }
  if (puStack_40 != (ulong *)0x0) {
    XFree();
  }
LAB_0022cfc6:
  if (xpos != (int *)0x0) {
    *xpos = iVar12;
  }
  if (ypos != (int *)0x0) {
    *ypos = iVar9;
  }
  if (width != (int *)0x0) {
    *width = iStack_68;
  }
  if (height != (int *)0x0) {
    *height = iStack_64;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorWorkarea(GLFWmonitor* handle,
                                    int* xpos, int* ypos,
                                    int* width, int* height)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;
    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorWorkarea(monitor, xpos, ypos, width, height);
}